

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

int push_function(Context_conflict *ctx,char *sym,MOJOSHADER_astDataType *dt,int just_declare)

{
  void *pvVar1;
  int iVar2;
  int local_4c;
  int idx;
  SymbolScope *item;
  void *iter;
  void *value;
  MOJOSHADER_astDataType *pMStack_28;
  int just_declare_local;
  MOJOSHADER_astDataType *dt_local;
  char *sym_local;
  Context_conflict *ctx_local;
  
  value._4_4_ = just_declare;
  pMStack_28 = dt;
  dt_local = (MOJOSHADER_astDataType *)sym;
  sym_local = (char *)ctx;
  if (ctx->is_func_scope != 0) {
    __assert_fail("!ctx->is_func_scope",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1ad,
                  "int push_function(Context *, const char *, const MOJOSHADER_astDataType *, const int)"
                 );
  }
  if (dt->type == MOJOSHADER_AST_DATATYPE_FUNCTION) {
    iter = (void *)0x0;
    item = (SymbolScope *)0x0;
    do {
      iVar2 = hash_iter(*(HashTable **)(sym_local + 0x58),dt_local,&iter,&item);
      pvVar1 = iter;
      if (iVar2 == 0) {
        local_4c = 0;
        if ((dt_local != (MOJOSHADER_astDataType *)0x0) &&
           (pMStack_28 != (MOJOSHADER_astDataType *)0x0)) {
          if ((pMStack_28->function).intrinsic == 0) {
            local_4c = *(int *)(sym_local + 0x8c) + 1;
            *(int *)(sym_local + 0x8c) = local_4c;
          }
          else {
            local_4c = *(int *)(sym_local + 0x90) + -1;
            *(int *)(sym_local + 0x90) = local_4c;
          }
        }
        push_symbol((Context_conflict *)sym_local,(SymbolMap *)(sym_local + 0x58),
                    (char *)&dt_local->type,pMStack_28,local_4c,0);
        return local_4c;
      }
      iVar2 = datatypes_match(pMStack_28,*(MOJOSHADER_astDataType **)((long)iter + 8));
    } while (iVar2 == 0);
    if (value._4_4_ == 0) {
      failf((Context_conflict *)sym_local,"Function \'%s\' already defined.",dt_local);
    }
    return *(int *)((long)pvVar1 + 0x10);
  }
  __assert_fail("dt->type == MOJOSHADER_AST_DATATYPE_FUNCTION",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1ae,
                "int push_function(Context *, const char *, const MOJOSHADER_astDataType *, const int)"
               );
}

Assistant:

static int push_function(Context *ctx, const char *sym,
                          const MOJOSHADER_astDataType *dt,
                          const int just_declare)
{
    // we don't have any reason to support nested functions at the moment,
    //  so this would be a bug.
    assert(!ctx->is_func_scope);
    assert(dt->type == MOJOSHADER_AST_DATATYPE_FUNCTION);

    // Functions are always global, so no need to search scopes.
    //  Functions overload, though, so we have to continue iterating to
    //  see if it matches anything.
    const void *value = NULL;
    void *iter = NULL;
    while (hash_iter(ctx->variables.hash, sym, &value, &iter))
    {
        // !!! FIXME: this breaks if you predeclare a function.
        // !!! FIXME:  (a declare AFTER defining works, though.)
        // there's already something called this.
        SymbolScope *item = (SymbolScope *) value;
        if (datatypes_match(dt, item->datatype))
        {
            if (!just_declare)
                failf(ctx, "Function '%s' already defined.", sym);
            return item->index;
        } // if
    } // while

    int idx = 0;
    if ((sym != NULL) && (dt != NULL))
    {
        if (!dt->function.intrinsic)
            idx = ++ctx->user_func_index;  // these are positive.
        else
            idx = --ctx->intrinsic_func_index;  // these are negative.
    } // if

    // push_symbol() doesn't check dupes, because we just did.
    push_symbol(ctx, &ctx->variables, sym, dt, idx, 0);

    return idx;
}